

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O0

void progress_monitor(j_common_ptr cinfo)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long in_RDI;
  int percent_done;
  int total_passes;
  int scan_no;
  cd_progress_ptr prog;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  if (((*(int *)(lVar1 + 0x28) != 0) && (*(int *)(in_RDI + 0x20) != 0)) &&
     (*(int *)(lVar1 + 0x28) < (int)*(uint *)(in_RDI + 0xac))) {
    fprintf(_stderr,"Scan number %d exceeds maximum scans (%d)\n",(ulong)*(uint *)(in_RDI + 0xac),
            (ulong)*(uint *)(lVar1 + 0x28));
    exit(1);
  }
  if (*(int *)(lVar1 + 0x2c) != 0) {
    uVar2 = *(int *)(lVar1 + 0x1c) + *(int *)(lVar1 + 0x24);
    uVar3 = (*(long *)(lVar1 + 8) * 100) / *(long *)(lVar1 + 0x10);
    if ((int)uVar3 != *(int *)(lVar1 + 0x30)) {
      *(int *)(lVar1 + 0x30) = (int)uVar3;
      if ((int)uVar2 < 2) {
        fprintf(_stderr,"\r %3d%% ",uVar3 & 0xffffffff);
      }
      else {
        fprintf(_stderr,"\rPass %d/%d: %3d%% ",
                (ulong)(*(int *)(lVar1 + 0x18) + *(int *)(lVar1 + 0x20) + 1),(ulong)uVar2,
                uVar3 & 0xffffffff);
      }
      fflush(_stderr);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
progress_monitor(j_common_ptr cinfo)
{
  cd_progress_ptr prog = (cd_progress_ptr)cinfo->progress;

  if (prog->max_scans != 0 && cinfo->is_decompressor) {
    int scan_no = ((j_decompress_ptr)cinfo)->input_scan_number;

    if (scan_no > (int)prog->max_scans) {
      fprintf(stderr, "Scan number %d exceeds maximum scans (%d)\n", scan_no,
              prog->max_scans);
      exit(EXIT_FAILURE);
    }
  }

  if (prog->report) {
    int total_passes = prog->pub.total_passes + prog->total_extra_passes;
    int percent_done =
      (int)(prog->pub.pass_counter * 100L / prog->pub.pass_limit);

    if (percent_done != prog->percent_done) {
      prog->percent_done = percent_done;
      if (total_passes > 1) {
        fprintf(stderr, "\rPass %d/%d: %3d%% ",
                prog->pub.completed_passes + prog->completed_extra_passes + 1,
                total_passes, percent_done);
      } else {
        fprintf(stderr, "\r %3d%% ", percent_done);
      }
      fflush(stderr);
    }
  }
}